

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2FDiv<double>
          (OptimizeInstructions *this,Binary *binary,double c)

{
  Const *pCVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  
  local_30.i64 = (int64_t)(1.0 / c);
  binary->op = MulFloat64;
  local_20 = 5;
  pCVar1 = Expression::cast<wasm::Const>(binary->right);
  Literal::operator=(&pCVar1->value,(Literal *)&local_30.func);
  Literal::~Literal((Literal *)&local_30.func);
  return (Expression *)binary;
}

Assistant:

Expression* optimizePowerOf2FDiv(Binary* binary, T c) {
    //
    // x / C_pot    =>   x * (C_pot ^ -1)
    //
    // Explanation:
    // Floating point numbers are represented as:
    //    ((-1) ^ sign) * (2 ^ (exp - bias)) * (1 + significand)
    //
    // If we have power of two numbers, then the mantissa (significand)
    // is all zeros. Let's focus on the exponent, ignoring the sign part:
    //    (2 ^ (exp - bias))
    //
    // and for inverted power of two floating point:
    //     1.0 / (2 ^ (exp - bias))   ->   2 ^ -(exp - bias)
    //
    // So inversion of C_pot is valid because it changes only the sign
    // of the exponent part and doesn't touch the significand part,
    // which remains the same (zeros).
    static_assert(std::is_same<T, float>::value ||
                    std::is_same<T, double>::value,
                  "type mismatch");
    double invDivisor = 1.0 / (double)c;
    binary->op = std::is_same<T, float>::value ? MulFloat32 : MulFloat64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(invDivisor));
    return binary;
  }